

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

ACT_TYPE __thiscall
despot::MeanMDPPolicy::Action
          (MeanMDPPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  ACT_TYPE AVar1;
  pointer ppSVar2;
  State *pSVar3;
  long lVar4;
  int state1_1;
  uint num_mdp_actions;
  ChainState *this_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ACT_TYPE action;
  ulong uVar10;
  ulong uVar11;
  int state2;
  long lVar12;
  undefined1 auVar13 [16];
  
  num_mdp_actions = (**(code **)(*(long *)this->chain_model_ + 0x28))();
  this_00 = (ChainState *)
            (**(code **)(*(long *)this->chain_model_ + 0xa8))
                      (0x3ff0000000000000,this->chain_model_,0xffffffffffffffff);
  ChainState::Init(this_00,5,num_mdp_actions);
  ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2;
  uVar6 = lVar5 >> 3;
  uVar7 = 0;
  uVar11 = (ulong)num_mdp_actions;
  if ((int)num_mdp_actions < 1) {
    uVar11 = uVar7;
  }
  for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
    pSVar3 = ppSVar2[uVar7];
    for (lVar8 = 0; lVar8 != 5; lVar8 = lVar8 + 1) {
      for (uVar10 = 0; uVar10 != uVar11; uVar10 = uVar10 + 1) {
        lVar9 = *(long *)(*(long *)&(this_00->mdp_transitions_).
                                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data + uVar10 * 0x18);
        lVar4 = *(long *)(*(long *)(*(long *)(pSVar3 + 0x20) + lVar8 * 0x18) + uVar10 * 0x18);
        for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
          *(double *)(lVar9 + lVar12 * 8) =
               *(double *)(lVar9 + lVar12 * 8) + *(double *)(lVar4 + lVar12 * 8);
        }
      }
    }
  }
  auVar13._8_4_ = (int)(lVar5 >> 0x23);
  auVar13._0_8_ = uVar6;
  auVar13._12_4_ = 0x45300000;
  for (lVar5 = 0; lVar5 != 5; lVar5 = lVar5 + 1) {
    for (uVar7 = 0; uVar7 != uVar11; uVar7 = uVar7 + 1) {
      lVar8 = *(long *)(*(long *)&(this_00->mdp_transitions_).
                                  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar5].
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data + uVar7 * 0x18);
      for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
        *(double *)(lVar8 + lVar9 * 8) =
             *(double *)(lVar8 + lVar9 * 8) /
             ((auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
      }
    }
  }
  Chain::ComputeOptimalValue(this->chain_model_,this_00);
  AVar1 = *(ACT_TYPE *)
           ((this_00->policy).
            super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>._M_impl.
            super__Vector_impl_data._M_start +
           (long)*(int *)(*(particles->
                           super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                           _M_impl.super__Vector_impl_data._M_start + 0x38) * 0x10);
  (**(code **)(*(long *)this->chain_model_ + 0xb8))(this->chain_model_,this_00);
  return AVar1;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		int num_mdp_states = chain_model_->NUM_MDP_STATES, num_mdp_actions =
			chain_model_->NumActions();

		ChainState* mean = static_cast<ChainState*>(chain_model_->Allocate(-1,
			1.0));
		mean->Init(num_mdp_states, num_mdp_actions);

		// mean->mdp_state = cur_state_;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			ChainState* state = static_cast<ChainState*>(particle);
			for (int state1 = 0; state1 < num_mdp_states; state1++) {
				for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
					for (int state2 = 0; state2 < num_mdp_states; state2++) {
						double prob1 = mean->GetTransition(state1, action,
							state2);
						double prob2 = state->GetTransition(state1, action,
							state2);
						mean->SetTransition(state1, action, state2,
							prob1 + prob2);
					}
				}
			}
		}

		for (int state1 = 0; state1 < num_mdp_states; state1++) {
			for (ACT_TYPE action = 0; action < num_mdp_actions; action++) {
				for (int state2 = 0; state2 < num_mdp_states; state2++) {
					double prob = mean->GetTransition(state1, action, state2);
					mean->SetTransition(state1, action, state2,
						prob / particles.size());
				}
			}
		}

		chain_model_->ComputeOptimalValue(*mean);

		ACT_TYPE action =
			mean->policy[static_cast<ChainState*>(particles[0])->mdp_state].action;
		chain_model_->Free(mean);
		return action;
	}